

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

void __thiscall MeshLib::Solid::removeDanglingVertices(Solid *this)

{
  Vertex *__filename;
  ListNode<MeshLib::Vertex> *pLVar1;
  List<MeshLib::Vertex> *this_00;
  List<MeshLib::Vertex> dangling_verts;
  TreeIterator<MeshLib::Vertex> viter;
  List<MeshLib::Vertex> local_140;
  TreeIterator<MeshLib::Vertex> local_130;
  
  local_140.m_head = (ListNode<MeshLib::Vertex> *)0x0;
  local_140.m_size = 0;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_130,&this->m_verts);
  this_00 = &local_140;
  while (local_130.m_finished != true) {
    if ((local_130.m_pointer)->data->m_halfedge == (HalfEdge *)0x0) {
      List<MeshLib::Vertex>::Append(this_00,(local_130.m_pointer)->data);
    }
    AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_130);
  }
  while (pLVar1 = this_00->m_head, pLVar1 != (ListNode<MeshLib::Vertex> *)0x0) {
    __filename = pLVar1->m_data;
    AVL::Tree<MeshLib::Vertex>::remove(&this->m_verts,(char *)__filename);
    if (__filename != (Vertex *)0x0) {
      std::__cxx11::string::~string((string *)&__filename->m_string);
    }
    operator_delete(__filename);
    this_00 = (List<MeshLib::Vertex> *)&pLVar1->m_next;
  }
  List<MeshLib::Vertex>::~List(&local_140);
  return;
}

Assistant:

void 
Solid::removeDanglingVertices()
{
	List<Vertex> dangling_verts;
	//Label boundary edges
	for( AVL::TreeIterator<Vertex> viter( m_verts ); ! viter.end() ; ++ viter )
	{
		Solid::tVertex     v = *viter;
		if( v->halfedge() != NULL ) continue;
		dangling_verts.Append( v );
	}

	for( ListIterator<Vertex> iter( dangling_verts ); !iter.end(); ++ iter )
	{
		Solid::tVertex v = *iter;
		m_verts.remove( v );
		delete v;
		v = NULL;
	}
}